

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O2

void __thiscall
ParserProbModelXML::AddToLocalSFActionScope(ParserProbModelXML *this,Index sfI,Scope *AScope)

{
  pointer pSVar1;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  while (pSVar1 = (this->_m_AScopes_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                  super__Vector_impl_data._M_start,
        (ulong)(((long)(this->_m_AScopes_Y).super__Vector_base<Scope,_std::allocator<Scope>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x18) <=
        (ulong)sfI) {
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<Scope,_std::allocator<Scope>_>::emplace_back<Scope>
              (&this->_m_AScopes_Y,(Scope *)&local_48);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  }
  Scope::Insert(pSVar1 + sfI,AScope);
  return;
}

Assistant:

void ParserProbModelXML::AddToLocalSFActionScope(Index sfI, Scope AScope)
{
    while(_m_AScopes_Y.size() <= sfI)
        _m_AScopes_Y.push_back(Scope());
    
    _m_AScopes_Y[sfI].Insert(AScope);
}